

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.cpp
# Opt level: O0

bool __thiscall
helics::apps::AsioBrokerServer::udpDataReceive
          (AsioBrokerServer *this,shared_ptr<helics::udp::UdpServer> *server,char *data,
          size_t bytes_received)

{
  string_view message;
  bool bVar1;
  action_t aVar2;
  element_type *this_00;
  size_type in_RCX;
  allocator<char> *in_RDX;
  void *in_RDI;
  system_error *anon_var_0;
  ActionMessage rep;
  ActionMessage m;
  char *in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  byte in_stack_fffffffffffffdc7;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  ActionMessage *in_stack_fffffffffffffdf0;
  CoreType in_stack_fffffffffffffdfc;
  portData *in_stack_fffffffffffffe00;
  ActionMessage *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  int iVar3;
  ActionMessage local_198 [2];
  size_type local_28;
  allocator<char> *local_20;
  byte local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  ActionMessage::ActionMessage(in_stack_fffffffffffffdf0,in_RDI,(size_t)in_stack_fffffffffffffde0);
  bVar1 = isProtocolCommand((ActionMessage *)
                            CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
  if (bVar1) {
    TypedBrokerServer::generateMessageResponse
              (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
    aVar2 = ActionMessage::action(local_198);
    if (aVar2 != cmd_ignore) {
      this_00 = CLI::std::
                __shared_ptr_access<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x202702);
      ActionMessage::to_string_abi_cxx11_
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
      message._M_str = (char *)in_stack_fffffffffffffdf0;
      message._M_len = (size_t)in_RDI;
      udp::UdpServer::reply(this_00,message);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
    }
    iVar3 = 0;
    ActionMessage::~ActionMessage
              ((ActionMessage *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
    if (iVar3 != 0) goto LAB_00202928;
  }
  else if (local_28 == 5) {
    __s = &stack0xfffffffffffffdf7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_stack_fffffffffffffde0,__s,local_28,local_20);
    in_stack_fffffffffffffdc7 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                         in_stack_fffffffffffffdb8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdf7);
    if ((in_stack_fffffffffffffdc7 & 1) != 0) {
      local_1 = 0;
      goto LAB_00202928;
    }
  }
  local_1 = 1;
LAB_00202928:
  ActionMessage::~ActionMessage
            ((ActionMessage *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
  return (bool)(local_1 & 1);
}

Assistant:

bool AsioBrokerServer::udpDataReceive(const std::shared_ptr<udp::UdpServer>& server,
                                          const char* data,
                                          size_t bytes_received)
    {
        ActionMessage m(data, static_cast<int>(bytes_received));
        if (isProtocolCommand(m)) {
            // if the reply is not ignored respond with it otherwise
            // forward the original message on to the receiver to handle
            auto rep = generateMessageResponse(m, udpPortData, CoreType::UDP);
            if (rep.action() != CMD_IGNORE) {
                try {
                    server->reply(rep.to_string());
                }
                catch (const std::system_error&) {
                    return false;
                }
            }
        } else if (bytes_received == 5) {
            if (std::string(data, bytes_received) == "close") {
                return false;
            }
        }

        return true;
    }